

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

ssize_t __thiscall
ft::list<double,_ft::allocator<double>_>::splice
          (list<double,_ft::allocator<double>_> *this,int __fdin,__off64_t *__offin,int __fdout,
          __off64_t *__offout,size_t __len,uint __flags)

{
  Node *pNVar1;
  Node *pNVar2;
  undefined4 in_register_0000000c;
  listIterator<double> *this_00;
  undefined4 in_register_00000034;
  listIterator<double> *this_01;
  node *first;
  iterator *i_local;
  list<double,_ft::allocator<double>_> *x_local;
  iterator *position_local;
  list<double,_ft::allocator<double>_> *this_local;
  
  this_01 = (listIterator<double> *)CONCAT44(in_register_00000034,__fdin);
  this_00 = (listIterator<double> *)CONCAT44(in_register_0000000c,__fdout);
  pNVar1 = listIterator<double>::node(this_01);
  pNVar2 = listIterator<double>::node(this_00);
  if (pNVar1 != pNVar2) {
    pNVar1 = listIterator<double>::node(this_01);
    pNVar2 = listIterator<double>::node(this_00);
    if (pNVar1 != pNVar2->next) {
      pNVar1 = listIterator<double>::node(this_00);
      unlinkNodes(this,pNVar1,pNVar1);
      pNVar2 = listIterator<double>::node(this_01);
      linkNodes(this,pNVar2,pNVar1,pNVar1);
      this->m_size = this->m_size + 1;
      __offin[2] = __offin[2] + -1;
      pNVar1 = (Node *)__offin;
    }
  }
  return (ssize_t)pNVar1;
}

Assistant:

void splice(iterator position, list & x, iterator i) {
		if (position.node() != i.node() && position.node() != i.node()->next) {
			node*	first = i.node();
			this->unlinkNodes(first, first);
			this->linkNodes(position.node(), first, first);
			++this->m_size;
			--x.m_size;
		}
	}